

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTaskExecutor.h
# Opt level: O2

void HighsTaskExecutor::sync_stolen_task(HighsSplitDeque *localDeque,HighsTask *stolenTask)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  HighsSplitDeque *stealer;
  HighsSplitDeque *local_30;
  
  bVar1 = HighsSplitDeque::leapfrogStolenTask(localDeque,stolenTask,&local_30);
  if (!bVar1) {
    iVar4 = (localDeque->ownerData).numWorkers * 0x10 + -0x10;
    lVar2 = std::chrono::_V2::system_clock::now();
    do {
      iVar5 = 0;
      if (0 < iVar4) {
        iVar5 = iVar4;
      }
      while (bVar1 = iVar5 != 0, iVar5 = iVar5 + -1, bVar1) {
        if (((stolenTask->metadata).stealer.super___atomic_base<unsigned_long>._M_i & 1) != 0)
        goto LAB_0028d3a0;
        HighsSplitDeque::yield(localDeque);
      }
      lVar3 = std::chrono::_V2::system_clock::now();
      iVar4 = iVar4 * 2;
    } while (lVar3 - lVar2 < 5000000);
    if (((stolenTask->metadata).stealer.super___atomic_base<unsigned_long>._M_i & 1) == 0) {
      HighsSplitDeque::waitForTaskToFinish(localDeque,stolenTask,local_30);
    }
  }
LAB_0028d3a0:
  HighsSplitDeque::popStolen(localDeque);
  return;
}

Assistant:

static void sync_stolen_task(HighsSplitDeque* localDeque,
                               HighsTask* stolenTask) {
    HighsSplitDeque* stealer;
    if (!localDeque->leapfrogStolenTask(stolenTask, stealer)) {
      const int numWorkers = localDeque->getNumWorkers();
      int numTries = HighsSchedulerConstants::kNumTryFac * (numWorkers - 1);

      auto tStart = std::chrono::high_resolution_clock::now();

      while (true) {
        for (int s = 0; s < numTries; ++s) {
          if (stolenTask->isFinished()) {
            localDeque->popStolen();
            return;
          }
          localDeque->yield();
        }

        auto numMicroSecs =
            std::chrono::duration_cast<std::chrono::microseconds>(
                std::chrono::high_resolution_clock::now() - tStart)
                .count();

        if (numMicroSecs < HighsSchedulerConstants::kMicroSecsBeforeSleep)
          numTries *= 2;
        else
          break;
      }

      if (!stolenTask->isFinished())
        localDeque->waitForTaskToFinish(stolenTask, stealer);
    }

    localDeque->popStolen();
  }